

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_user_exception_ls(sexp ctx,sexp self,char *msg,int n,...)

{
  char in_AL;
  long lVar1;
  sexp psVar2;
  int in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  sexp in_RDI;
  sexp in_XMM2_Qa;
  char *in_XMM2_Qb;
  sexp in_XMM3_Qa;
  sexp in_XMM3_Qb;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp ir;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp res;
  va_list ap;
  int i;
  undefined4 in_stack_fffffffffffffee0;
  uint in_stack_fffffffffffffee4;
  uint uVar3;
  sexp in_stack_fffffffffffffee8;
  sexp in_stack_fffffffffffffef0;
  sexp in_stack_fffffffffffffef8;
  sexp in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  sexp in_stack_ffffffffffffff48;
  sexp in_stack_ffffffffffffff50;
  sexp_gc_var_t local_68;
  sexp local_58;
  sexp_gc_var_t local_50;
  sexp_conflict local_40;
  uint local_38 [2];
  sexp local_30;
  undefined1 *local_28;
  int local_20;
  int local_1c;
  undefined8 local_18;
  undefined8 local_10;
  sexp local_8;
  
  if (in_AL != '\0') {
    in_stack_ffffffffffffff38 = in_XMM2_Qa;
    in_stack_ffffffffffffff40 = in_XMM2_Qb;
    in_stack_ffffffffffffff48 = in_XMM3_Qa;
    in_stack_ffffffffffffff50 = in_XMM3_Qb;
  }
  local_40 = (sexp_conflict)0x43e;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(&local_50,0,0x10);
  local_58 = (sexp)0x43e;
  memset(&local_68,0,0x10);
  local_50.var = &local_40;
  local_50.next = (local_8->value).context.saves;
  (local_8->value).context.saves = &local_50;
  local_68.var = &local_58;
  local_68.next = (local_8->value).context.saves;
  (local_8->value).context.saves = &local_68;
  local_28 = &stack0xfffffffffffffee8;
  local_30 = (sexp)&stack0x00000008;
  local_38[1] = 0x30;
  local_38[0] = 0x20;
  local_58 = (sexp)&DAT_0000023e;
  for (local_20 = 0; uVar3 = local_38[0], local_20 < local_1c; local_20 = local_20 + 1) {
    if (local_38[0] < 0x29) {
      lVar1 = (long)(int)local_38[0];
      local_38[0] = local_38[0] + 8;
      psVar2 = (sexp)(local_28 + lVar1);
    }
    else {
      psVar2 = local_30;
      local_30 = (sexp)&local_30->value;
    }
    local_58 = sexp_cons_op(in_stack_fffffffffffffee8,
                            (sexp)CONCAT44(uVar3,in_stack_fffffffffffffee0),(sexp_sint_t)local_38,
                            local_8,psVar2);
    in_stack_fffffffffffffee4 = uVar3;
  }
  local_58 = sexp_nreverse_op(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                              (sexp_sint_t)in_stack_fffffffffffffee8,
                              (sexp)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  psVar2 = sexp_user_exception(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                               in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  (local_8->value).context.saves = local_50.next;
  return psVar2;
}

Assistant:

sexp sexp_user_exception_ls (sexp ctx, sexp self, const char *msg, int n, ...) {
  int i;
  va_list ap;
  sexp_gc_var2(res, ir);
  sexp_gc_preserve2(ctx, res, ir);
  va_start(ap, n);
  for (i=0, ir=SEXP_NULL; i < n; ++i) {
    ir = sexp_cons(ctx, va_arg(ap, sexp), ir);
  }
  ir = sexp_nreverse(ctx, ir);
  res = sexp_user_exception(ctx, self, msg, ir);
  sexp_gc_release2(ctx);
  va_end(ap);
  return res;
}